

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_print.c
# Opt level: O2

rfc5444_result rfc5444_print_direct(autobuf *out,void *buffer,size_t length)

{
  rfc5444_result result;
  char *pcVar1;
  rfc5444_reader reader;
  rfc5444_reader local_228;
  rfc5444_print_session local_1b0;
  
  local_228.packet_consumer.list_head.next = (list_entity *)0x0;
  local_228.packet_consumer.list_head.prev = (list_entity *)0x0;
  local_228.packet_consumer.root = (avl_node *)0x0;
  local_228.packet_consumer.count = 0;
  local_228.packet_consumer.allow_dups = false;
  local_228.packet_consumer._29_3_ = 0;
  local_228.packet_consumer.comp = (_func_int_void_ptr_void_ptr *)0x0;
  local_228.message_consumer.list_head.next = (list_entity *)0x0;
  local_228.message_consumer.list_head.prev = (list_entity *)0x0;
  local_228.message_consumer.root = (avl_node *)0x0;
  local_228.message_consumer.count = 0;
  local_228.message_consumer.allow_dups = false;
  local_228.message_consumer._29_3_ = 0;
  local_228.message_consumer.comp = (_func_int_void_ptr_void_ptr *)0x0;
  local_228.forward_message =
       (_func_void_rfc5444_reader_tlvblock_context_ptr_uint8_t_ptr_size_t *)0x0;
  local_228.malloc_tlvblock_entry = (_func_rfc5444_reader_tlvblock_entry_ptr *)0x0;
  local_228.malloc_addrblock_entry = (_func_rfc5444_reader_addrblock_entry_ptr *)0x0;
  local_228.free_tlvblock_entry = (_func_void_rfc5444_reader_tlvblock_entry_ptr *)0x0;
  local_228.free_addrblock_entry = (_func_void_rfc5444_reader_addrblock_entry_ptr *)0x0;
  memset(&local_1b0.print_packet,0,0x178);
  local_1b0.output = out;
  rfc5444_reader_init(&local_228);
  rfc5444_print_add(&local_1b0,&local_228);
  result = rfc5444_reader_handle_packet(&local_228,(uint8_t *)buffer,length);
  if (result != RFC5444_OKAY) {
    pcVar1 = rfc5444_strerror(result);
    abuf_appendf(out,"Error while parsing rfc5444: %s\n",pcVar1);
  }
  rfc5444_print_remove(&local_1b0);
  rfc5444_reader_cleanup(&local_228);
  return result;
}

Assistant:

enum rfc5444_result
rfc5444_print_direct(struct autobuf *out, void *buffer, size_t length)
{
  struct rfc5444_reader reader;
  struct rfc5444_print_session session;
  enum rfc5444_result result;

  memset(&reader, 0, sizeof(reader));
  memset(&session, 0, sizeof(session));

  session.output = out;

  rfc5444_reader_init(&reader);
  rfc5444_print_add(&session, &reader);

  result = rfc5444_reader_handle_packet(&reader, buffer, length);
  if (result) {
    abuf_appendf(out, "Error while parsing rfc5444: %s\n", rfc5444_strerror(result));
  }
  rfc5444_print_remove(&session);
  rfc5444_reader_cleanup(&reader);

  return result;
}